

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedSetGet.cpp
# Opt level: O1

IterateResult __thiscall glcts::DrawBuffersIndexedSetGet::iterate(DrawBuffersIndexedSetGet *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *description;
  BlendMaskStateMachine state;
  GLint maxDrawBuffers;
  BlendMaskStateMachine local_48;
  int local_1c;
  
  iVar2 = (*((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_1c = 0;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))(0x8824,&local_1c);
  if (local_1c < 4) {
    tcu::TestContext::setTestResult
              ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.super_TestNode
               .m_testCtx,QP_TEST_RESULT_FAIL,"Minimum number of draw buffers too low");
    return STOP;
  }
  DrawBuffersIndexedBase::BlendMaskStateMachine::BlendMaskStateMachine
            (&local_48,(this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context,
             ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.super_TestNode.
             m_testCtx)->m_log,local_1c);
  DrawBuffersIndexedBase::BlendMaskStateMachine::SetEnable(&local_48);
  DrawBuffersIndexedBase::BlendMaskStateMachine::SetColorMask(&local_48,'\0','\0','\0','\0');
  DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquation(&local_48,0x800a);
  DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFunc(&local_48,0x8004,0x308);
  bVar1 = DrawBuffersIndexedBase::BlendMaskStateMachine::CheckAll(&local_48);
  if (bVar1) {
    DrawBuffersIndexedBase::BlendMaskStateMachine::SetDisablei(&local_48,1);
    DrawBuffersIndexedBase::BlendMaskStateMachine::SetColorMaski
              (&local_48,1,'\x01','\x01','\x01','\x01');
    DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquationi(&local_48,1,0x8007);
    DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFunci(&local_48,1,0x307,0x8003);
    bVar1 = DrawBuffersIndexedBase::BlendMaskStateMachine::CheckAll(&local_48);
    if (bVar1) {
      DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquationSeparatei
                (&local_48,2,0x8008,0x8006);
      DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFuncSeparatei
                (&local_48,2,0,1,0x300,0x306);
      bVar1 = DrawBuffersIndexedBase::BlendMaskStateMachine::CheckAll(&local_48);
      if (bVar1) {
        DrawBuffersIndexedBase::BlendMaskStateMachine::SetDefaults(&local_48);
        iVar2 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
        description = "Pass";
        if (iVar2 != 0) {
          description = "Some functions generated error";
        }
        tcu::TestContext::setTestResult
                  ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                   super_TestNode.m_testCtx,(uint)(iVar2 != 0),description);
        goto LAB_00cf6907;
      }
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_FAIL,"Failed to change blending and color mask state");
LAB_00cf6907:
  if (local_48.state.
      super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.state.
                    super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.state.
                          super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.state.
                          super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DrawBuffersIndexedSetGet::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// Check number of available draw buffers
	glw::GLint maxDrawBuffers = 0;
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	if (maxDrawBuffers < 4)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Minimum number of draw buffers too low");
		return STOP;
	}

	BlendMaskStateMachine state(m_context, m_testCtx.getLog(), maxDrawBuffers);

	state.SetEnable();
	state.SetColorMask(0, 0, 0, 0);
	state.SetBlendEquation(GL_FUNC_SUBTRACT);
	state.SetBlendFunc(GL_ONE_MINUS_CONSTANT_ALPHA, GL_SRC_ALPHA_SATURATE);
	if (!state.CheckAll())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to change blending and color mask state");
		return STOP;
	}

	state.SetDisablei(1);
	state.SetColorMaski(1, 1, 1, 1, 1);
	state.SetBlendEquationi(1, GL_MIN);
	state.SetBlendFunci(1, GL_ONE_MINUS_DST_COLOR, GL_CONSTANT_ALPHA);
	if (!state.CheckAll())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to change blending and color mask state");
		return STOP;
	}

	state.SetBlendEquationSeparatei(2, GL_MAX, GL_FUNC_ADD);
	state.SetBlendFuncSeparatei(2, GL_ZERO, GL_ONE, GL_SRC_COLOR, GL_DST_COLOR);
	if (!state.CheckAll())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to change blending and color mask state");
		return STOP;
	}

	state.SetDefaults();

	// Check for error
	glw::GLenum error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Some functions generated error");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}